

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vmsummbm_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  undefined4 uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [14];
  long lVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  int32_t prod [16];
  
  lVar11 = 0;
  do {
    uVar1 = *(undefined4 *)((long)a + lVar11);
    uVar16 = (undefined1)((uint)uVar1 >> 0x18);
    uVar15 = (undefined1)((uint)uVar1 >> 0x10);
    uVar14 = (undefined1)((uint)uVar1 >> 8);
    auVar12._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar16,uVar16),uVar15),CONCAT14(uVar15,uVar1)) >> 0x20);
    auVar12[3] = uVar14;
    auVar12[2] = uVar14;
    auVar12[0] = (undefined1)uVar1;
    auVar12[1] = auVar12[0];
    auVar12._8_8_ = 0;
    uVar1 = *(undefined4 *)((long)b + lVar11);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar8;
    auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar6[8] = (char)((uint)uVar1 >> 0x10);
    auVar6._0_8_ = uVar8;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar9._5_8_ = 0;
    auVar9._0_5_ = auVar6._8_5_;
    auVar17._0_4_ = (undefined4)uVar8;
    auVar7[4] = (char)((uint)uVar1 >> 8);
    auVar7._0_4_ = auVar17._0_4_;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
    auVar17._4_9_ = auVar7._4_9_;
    auVar17._13_3_ = 0;
    auVar12 = psraw(auVar12,8);
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar12._0_10_;
    auVar2._12_2_ = auVar12._6_2_;
    auVar3._8_2_ = auVar12._4_2_;
    auVar3._0_8_ = auVar12._0_8_;
    auVar3._10_4_ = auVar2._10_4_;
    auVar10._6_8_ = 0;
    auVar10._0_6_ = auVar3._8_6_;
    auVar4._4_2_ = auVar12._2_2_;
    auVar4._0_4_ = auVar12._0_4_;
    auVar4._6_8_ = SUB148(auVar10 << 0x40,6);
    auVar13._0_4_ = auVar12._0_4_ & 0xffff;
    auVar13._4_10_ = auVar4._4_10_;
    auVar13._14_2_ = 0;
    auVar12 = pmaddwd(auVar13,auVar17);
    *(undefined1 (*) [16])(prod + lVar11) = auVar12;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  lVar11 = 0xc;
  do {
    *(int32_t *)((long)r + lVar11) =
         prod[lVar11 + 3] + prod[lVar11 + 1] + prod[lVar11 + 2] + prod[lVar11] +
         *(int *)((long)c + lVar11);
    lVar11 = lVar11 + -4;
  } while (lVar11 != -4);
  return;
}

Assistant:

void helper_vmsummbm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[16];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s8); i++) {
        prod[i] = (int32_t)a->s8[i] * b->u8[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        r->s32[i] = c->s32[i] + prod[4 * i] + prod[4 * i + 1] +
            prod[4 * i + 2] + prod[4 * i + 3];
    }
}